

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O2

void __thiscall
ValidationSignals::MempoolTransactionsRemovedForBlock
          (ValidationSignals *this,
          vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
          *txs_removed_for_block,uint nBlockHeight)

{
  unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_> uVar1;
  bool bVar2;
  _func_void *p_Var3;
  vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_> *pvVar4;
  anon_class_40_3_9e0b9ba9_for_event *this_00;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  char *local_e8;
  uint local_e0;
  vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_> local_d8;
  __1 local_c0 [24];
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  char *local_name;
  anon_class_40_3_9e0b9ba9_for_event event;
  uint nBlockHeight_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &event;
  pvVar4 = txs_removed_for_block;
  nBlockHeight_local = nBlockHeight;
  std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::vector
            (&this_00->txs_removed_for_block,txs_removed_for_block);
  local_name = "MempoolTransactionsRemovedForBlock";
  event.nBlockHeight = nBlockHeight;
  event.this = this;
  bVar2 = ::LogAcceptCategory((LogFlags)this_00,(Level)pvVar4);
  local_e8 = "MempoolTransactionsRemovedForBlock";
  if (bVar2) {
    local_e8 = (char *)(((long)(txs_removed_for_block->
                               super__Vector_base<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(txs_removed_for_block->
                              super__Vector_base<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
                              )._M_impl.super__Vector_impl_data._M_start) / 0x28);
    logging_function._M_str = "MempoolTransactionsRemovedForBlock";
    logging_function._M_len = 0x22;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp"
    ;
    source_file._M_len = 0x67;
    LogPrintFormatInternal<char_const*,unsigned_int,unsigned_long>
              (logging_function,source_file,0xe4,VALIDATION,Debug,
               (ConstevalFormatString<3U>)0x6c8faf,&local_name,&nBlockHeight_local,
               (unsigned_long *)&local_e8);
    local_e8 = local_name;
    nBlockHeight = nBlockHeight_local;
  }
  uVar1._M_t.
  super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>.
  _M_t.
  super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
  .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl =
       (((this->m_internals)._M_t.
         super___uniq_ptr_impl<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>.
         _M_t.
         super__Tuple_impl<0UL,_ValidationSignalsImpl_*,_std::default_delete<ValidationSignalsImpl>_>
         .super__Head_base<0UL,_ValidationSignalsImpl_*,_false>._M_head_impl)->m_task_runner)._M_t;
  local_e0 = nBlockHeight;
  std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::vector
            (&local_d8,txs_removed_for_block);
  MempoolTransactionsRemovedForBlock(std::vector<RemovedMempoolTransactionInfo,std::allocator<RemovedMempoolTransactionInfo>>const&,unsigned_int)
  ::$_1::__1(local_c0,&event);
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  p_Var3 = (_func_void *)operator_new(0x50);
  *(uint *)(p_Var3 + 8) = local_e0;
  *(char **)p_Var3 = local_e8;
  std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::vector
            ((vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
              *)(p_Var3 + 0x10),&local_d8);
  std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::vector
            ((vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
              *)(p_Var3 + 0x28),
             (vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>
              *)local_c0);
  *(undefined4 *)(p_Var3 + 0x40) = local_a8;
  *(undefined4 *)(p_Var3 + 0x44) = uStack_a4;
  *(undefined4 *)(p_Var3 + 0x48) = uStack_a0;
  *(undefined4 *)(p_Var3 + 0x4c) = uStack_9c;
  pcStack_80 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp:226:5)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp:226:5)>
             ::_M_manager;
  local_98._M_unused._0_8_ = (undefined8)p_Var3;
  (**(code **)(*(long *)uVar1._M_t.
                        super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                        .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl +
              0x10))(uVar1._M_t.
                     super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                     .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  MempoolTransactionsRemovedForBlock(std::vector<RemovedMempoolTransactionInfo,std::allocator<RemovedMempoolTransactionInfo>>const&,unsigned_int)
  ::$_0::~__0((__0 *)&local_e8);
  std::vector<RemovedMempoolTransactionInfo,_std::allocator<RemovedMempoolTransactionInfo>_>::
  ~vector(&event.txs_removed_for_block);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::MempoolTransactionsRemovedForBlock(const std::vector<RemovedMempoolTransactionInfo>& txs_removed_for_block, unsigned int nBlockHeight)
{
    auto event = [txs_removed_for_block, nBlockHeight, this] {
        m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.MempoolTransactionsRemovedForBlock(txs_removed_for_block, nBlockHeight); });
    };
    ENQUEUE_AND_LOG_EVENT(event, "%s: block height=%s txs removed=%s", __func__,
                          nBlockHeight,
                          txs_removed_for_block.size());
}